

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O3

void vu_dialog(t_vu *x,t_symbol *s,int argc,t_atom *argv)

{
  t_iem_fstyle_flags *ptVar1;
  t_iem_init_symargs *ptVar2;
  int iVar3;
  _glist *canvas;
  int iVar4;
  t_symbol *s_00;
  int iVar5;
  t_float tVar6;
  t_float tVar7;
  t_float tVar8;
  t_floatarg fscale;
  t_symbol *srl [3];
  t_atom undo [18];
  t_symbol *local_178 [4];
  t_atom local_158 [2];
  undefined4 local_138;
  undefined4 local_130;
  undefined4 local_128;
  undefined4 local_120;
  undefined4 local_118;
  float local_110;
  undefined4 local_108;
  undefined4 local_100;
  undefined4 local_68;
  t_symbol *local_60;
  
  tVar6 = atom_getfloatarg(0,argc,argv);
  tVar7 = atom_getfloatarg(1,argc,argv);
  tVar8 = atom_getfloatarg(4,argc,argv);
  iemgui_setdialogatoms(&x->x_gui,0x12,local_158);
  local_138 = 1;
  local_130 = 0x3c23d70a;
  local_128 = 1;
  local_120 = 0x3f800000;
  local_118 = 1;
  local_110 = (float)x->x_scale;
  local_108 = 1;
  local_100 = 0xbf800000;
  local_68 = 2;
  local_60 = gensym("none");
  canvas = (x->x_gui).x_glist;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,local_158,argc,argv);
  iemgui_dialog(&x->x_gui,local_178,argc,argv);
  ptVar1 = &(x->x_gui).x_fsf;
  *(byte *)ptVar1 = *(byte *)ptVar1 & 0x7f;
  ptVar2 = &(x->x_gui).x_isa;
  *(byte *)ptVar2 = *(byte *)ptVar2 & 0xfe;
  iVar4 = iemgui_clip_size((int)tVar6);
  iVar3 = ((x->x_gui).x_glist)->gl_zoom;
  iVar5 = 2;
  if (2 < (int)tVar7 / 0x28) {
    iVar5 = (int)tVar7 / 0x28;
  }
  (x->x_gui).x_w = iVar4 * iVar3;
  x->x_led_size = iVar5 + -1;
  (x->x_gui).x_h = iVar5 * iVar3 * 0x28;
  if ((int)tVar8 == 0) {
    fscale = 0.0;
  }
  else {
    fscale = 1.0;
  }
  vu_scale(x,fscale);
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void vu_dialog(t_vu *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *srl[3];
    int w = (int)atom_getfloatarg(0, argc, argv);
    int h = (int)atom_getfloatarg(1, argc, argv);
    int scale = (int)atom_getfloatarg(4, argc, argv);
    int sr_flags;
    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT(undo+2, 0.01);
    SETFLOAT(undo+3, 1);
    SETFLOAT(undo+4, x->x_scale);
    SETFLOAT(undo+5, -1);
    SETSYMBOL(undo+15, gensym("none"));
    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    x->x_gui.x_fsf.x_snd_able = 0;
    x->x_gui.x_isa.x_loadinit = 0;
    x->x_gui.x_w = iemgui_clip_size(w) * IEMGUI_ZOOM(x);
    vu_check_height(x, h);
    if(scale != 0)
        scale = 1;
    vu_scale(x, (t_float)scale);
    iemgui_size(x, &x->x_gui);
}